

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

TestCase *
vkt::pipeline::anon_unknown_0::newTestCase<vkt::pipeline::(anonymous_namespace)::BasicComputeTest>
          (TestContext *testContext,TimestampTestParam *testParam)

{
  TimestampTestParam *testContext_00;
  BasicComputeTest *this;
  char *pcVar1;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88;
  allocator<char> local_65 [13];
  string local_58 [32];
  string local_38;
  TimestampTestParam *local_18;
  TimestampTestParam *testParam_local;
  TestContext *testContext_local;
  
  local_18 = testParam;
  testParam_local = (TimestampTestParam *)testContext;
  this = (BasicComputeTest *)operator_new(0x90);
  testContext_00 = testParam_local;
  (**local_18->_vptr_TimestampTestParam)(local_58);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,local_65);
  (*local_18->_vptr_TimestampTestParam[1])(local_a8);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_a9);
  BasicComputeTest::BasicComputeTest
            (this,(TestContext *)testContext_00,&local_38,&local_88,local_18);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(local_65);
  std::__cxx11::string::~string(local_58);
  return (TestCase *)this;
}

Assistant:

vkt::TestCase* newTestCase(tcu::TestContext&     testContext,
						   TimestampTestParam*   testParam)
{
	return new Test(testContext,
					testParam->generateTestName().c_str(),
					testParam->generateTestDescription().c_str(),
					testParam);
}